

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O0

bool CheckProgram(GLuint handle,char *desc)

{
  PFNGLGETPROGRAMINFOLOGPROC p_Var1;
  FILE *__stream;
  GLsizei GVar2;
  char *pcVar3;
  undefined1 local_30 [8];
  ImVector<char> buf;
  GLint log_length;
  GLint status;
  char *desc_local;
  GLuint handle_local;
  
  buf.Data._4_4_ = 0;
  buf.Data._0_4_ = 0;
  (*glad_debug_glGetProgramiv)(handle,0x8b82,(GLint *)((long)&buf.Data + 4));
  (*glad_debug_glGetProgramiv)(handle,0x8b84,(GLint *)&buf.Data);
  if ((buf.Data._4_4_ & 0xff) == 0) {
    fprintf(_stderr,
            "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to link %s! (with GLSL \'%s\')\n",
            desc,g_GlslVersionString);
  }
  if (1 < (int)buf.Data) {
    ImVector<char>::ImVector((ImVector<char> *)local_30);
    ImVector<char>::resize((ImVector<char> *)local_30,(int)buf.Data + 1);
    GVar2 = (int)buf.Data;
    p_Var1 = glad_debug_glGetProgramInfoLog;
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    (*p_Var1)(handle,GVar2,(GLsizei *)0x0,pcVar3);
    __stream = _stderr;
    pcVar3 = ImVector<char>::begin((ImVector<char> *)local_30);
    fprintf(__stream,"%s\n",pcVar3);
    ImVector<char>::~ImVector((ImVector<char> *)local_30);
  }
  return (buf.Data._4_4_ & 0xff) == 1;
}

Assistant:

static bool CheckProgram(GLuint handle, const char* desc)
{
    GLint status = 0, log_length = 0;
    glGetProgramiv(handle, GL_LINK_STATUS, &status);
    glGetProgramiv(handle, GL_INFO_LOG_LENGTH, &log_length);
    if ((GLboolean)status == GL_FALSE)
        fprintf(stderr, "ERROR: ImGui_ImplOpenGL3_CreateDeviceObjects: failed to link %s! (with GLSL '%s')\n", desc, g_GlslVersionString);
    if (log_length > 1)
    {
        ImVector<char> buf;
        buf.resize((int)(log_length + 1));
        glGetProgramInfoLog(handle, log_length, NULL, (GLchar*)buf.begin());
        fprintf(stderr, "%s\n", buf.begin());
    }
    return (GLboolean)status == GL_TRUE;
}